

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<GPollFDWithQSocketNotifier_*>::reallocate
          (QPodArrayOps<GPollFDWithQSocketNotifier_*> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<GPollFDWithQSocketNotifier_*>_*,_GPollFDWithQSocketNotifier_**> pVar1;
  
  pVar1 = QTypedArrayData<GPollFDWithQSocketNotifier_*>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<GPollFDWithQSocketNotifier_*>).d,
                     (this->super_QArrayDataPointer<GPollFDWithQSocketNotifier_*>).ptr,alloc,option)
  ;
  if (pVar1.second != (GPollFDWithQSocketNotifier **)0x0) {
    (this->super_QArrayDataPointer<GPollFDWithQSocketNotifier_*>).d = pVar1.first;
    (this->super_QArrayDataPointer<GPollFDWithQSocketNotifier_*>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }